

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpressionMatch __thiscall
QRegularExpression::matchView
          (QRegularExpression *this,QStringView subjectView,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  long lVar1;
  QStringView subject;
  void *pvVar2;
  QRegularExpressionMatchPrivate *in_RDX;
  storage_type_conflict *in_RSI;
  QRegularExpressionMatchPrivate *in_RDI;
  QRegularExpressionMatchPrivate *in_R8;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  QRegularExpressionMatchPrivate *priv;
  MatchType in_stack_ffffffffffffff3c;
  QString *in_stack_ffffffffffffff40;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> this_00;
  void *pvVar3;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  storage_type_conflict *psVar4;
  CheckSubjectStringOption checkSubjectStringOption;
  QRegularExpressionMatchPrivate *offset_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)
       (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)in_RDI;
  psVar4 = in_RSI;
  offset_00 = in_RDI;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::data
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72e18a);
  checkSubjectStringOption = (CheckSubjectStringOption)((ulong)psVar4 >> 0x20);
  QRegularExpressionPrivate::compilePattern
            ((QRegularExpressionPrivate *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pvVar2 = operator_new(0x60);
  pvVar3 = pvVar2;
  QString::QString((QString *)0x72e1bd);
  subject.m_data = in_RSI;
  subject.m_size = (qsizetype)pvVar3;
  uVar5 = in_stack_00000008;
  QRegularExpressionMatchPrivate::QRegularExpressionMatchPrivate
            ((QRegularExpressionMatchPrivate *)this_00.d.ptr,(QRegularExpression *)in_RDI,
             in_stack_ffffffffffffff40,subject,in_stack_ffffffffffffff3c,
             (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)SUB84((ulong)pvVar2 >> 0x20,0)
            );
  QString::~QString((QString *)0x72e220);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72e234);
  QRegularExpressionPrivate::doMatch
            ((QRegularExpressionPrivate *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),in_RDX,
             (qsizetype)offset_00,checkSubjectStringOption,in_R8);
  QRegularExpressionMatch::QRegularExpressionMatch
            ((QRegularExpressionMatch *)in_stack_ffffffffffffff40,
             (QRegularExpressionMatchPrivate *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_00000008)
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpression::matchView(QStringView subjectView,
                                                      qsizetype offset,
                                                      MatchType matchType,
                                                      MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   QString(),
                                                   subjectView,
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}